

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall ON_TextureMapping::ReverseTextureCoordinate(ON_TextureMapping *this,int dir)

{
  ON_Xform local_118;
  undefined1 local_98 [8];
  ON_Xform x;
  bool rc;
  int dir_local;
  ON_TextureMapping *this_local;
  
  x.m_xform[3][3]._3_1_ = false;
  if ((-1 < dir) && (dir < 4)) {
    x.m_xform[3][3]._4_4_ = dir;
    memcpy(local_98,&ON_Xform::IdentityTransformation,0x80);
    x.m_xform[(long)x.m_xform[3][3]._4_4_ + -1][(long)x.m_xform[3][3]._4_4_ + 3] = -1.0;
    x.m_xform[x.m_xform[3][3]._4_4_][2] = 1.0;
    ON_Xform::operator*(&local_118,(ON_Xform *)local_98,&this->m_uvw);
    memcpy(&this->m_uvw,&local_118,0x80);
    x.m_xform[3][3]._3_1_ = true;
  }
  return (bool)x.m_xform[3][3]._3_1_;
}

Assistant:

bool ON_TextureMapping::ReverseTextureCoordinate( int dir )
{
  bool rc = false;
  if ( 0 <= dir && dir <= 3 )
  {
    ON_Xform x(ON_Xform::IdentityTransformation);
    x.m_xform[dir][dir] = -1.0;
    x.m_xform[dir][3] = 1.0;
    m_uvw = x*m_uvw;
    rc = true;
  }
  return rc;
}